

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O3

bool __thiscall Memory::Recycler::HasPendingTrackObjects(Recycler *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = PageStack<FinalizableObject_*>::IsEmpty(&(this->markContext).trackStack);
  bVar2 = true;
  if (bVar1) {
    bVar1 = PageStack<FinalizableObject_*>::IsEmpty(&(this->parallelMarkContext1).trackStack);
    if (bVar1) {
      bVar1 = PageStack<FinalizableObject_*>::IsEmpty(&(this->parallelMarkContext2).trackStack);
      if (bVar1) {
        bVar2 = PageStack<FinalizableObject_*>::IsEmpty(&(this->parallelMarkContext3).trackStack);
        bVar2 = !bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool HasPendingTrackObjects() const { return markContext.HasPendingTrackObjects() || parallelMarkContext1.HasPendingTrackObjects() || parallelMarkContext2.HasPendingTrackObjects() || parallelMarkContext3.HasPendingTrackObjects(); }